

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O3

satoko_t * Gia_ManSatokoInit(Cnf_Dat_t *pCnf,satoko_opts_t *opts)

{
  int *lits;
  int iVar1;
  satoko_t *s;
  long lVar2;
  
  s = satoko_create();
  lVar2 = 0;
  do {
    if (pCnf->nClauses <= lVar2) {
      satoko_configure(s,opts);
      return s;
    }
    lits = pCnf->pClauses[lVar2];
    iVar1 = satoko_add_clause(s,lits,(int)((ulong)((long)pCnf->pClauses[lVar2 + 1] - (long)lits) >>
                                          2));
    lVar2 = lVar2 + 1;
  } while (iVar1 != 0);
  satoko_destroy(s);
  return (satoko_t *)0x0;
}

Assistant:

satoko_t * Gia_ManSatokoInit( Cnf_Dat_t * pCnf, satoko_opts_t * opts )
{
    satoko_t * pSat = satoko_create();
    int i;
    //sat_solver_setnvars( pSat, p->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
        {
            satoko_destroy( pSat );
            return NULL;
        }
    }
    satoko_configure(pSat, opts);
    return pSat;
}